

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void av1_inv_txfm2d_add_4x4_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  int8_t *piVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined7 in_register_00000009;
  int extraout_EDX;
  int extraout_EDX_00;
  int bit;
  int extraout_EDX_01;
  int flipud;
  int iVar8;
  __m128i in [4];
  
  piVar5 = av1_inv_txfm_shift_ls[0];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    idct4x4_sse4_1(in,in,0xc,0,bd,0);
    goto LAB_0037b253;
  case 1:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    idct4x4_sse4_1(in,in,0xc,0,bd,0);
    goto LAB_0037b486;
  case 2:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
LAB_0037b253:
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
LAB_0037b7a2:
    idct4x4_sse4_1(in,in,0xc,1,bd,0);
    goto LAB_0037b7ad;
  case 3:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
LAB_0037b486:
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
LAB_0037b4de:
    iadst4x4_sse4_1(in,in,0xc,1,bd,0);
    goto LAB_0037b7ad;
  case 4:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    idct4x4_sse4_1(in,in,0xc,0,bd,0);
    goto LAB_0037b808;
  case 5:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    idct4x4_sse4_1(in,in,0xc,1,bd,0);
    break;
  case 6:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    iVar8 = 1;
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    iadst4x4_sse4_1(in,in,0xc,1,bd,0);
    cVar1 = piVar5[1];
    goto LAB_0037b885;
  case 7:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    iadst4x4_sse4_1(in,in,0xc,1,bd,0);
    break;
  case 8:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
LAB_0037b808:
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
LAB_0037b861:
    iadst4x4_sse4_1(in,in,0xc,1,bd,0);
    cVar1 = piVar5[1];
    iVar8 = 0;
LAB_0037b885:
    flipud = 1;
    goto LAB_0037b888;
  case 9:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iidentity4_sse4_1(in,in,stride,0,bd,0);
    iVar8 = extraout_EDX_00;
    goto LAB_0037b5eb;
  case 10:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iidentity4_sse4_1(in,in,stride,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    goto LAB_0037b7a2;
  case 0xb:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    idct4x4_sse4_1(in,in,0xc,0,bd,0);
    iVar8 = extraout_EDX;
    goto LAB_0037b5eb;
  case 0xc:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iidentity4_sse4_1(in,in,stride,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    goto LAB_0037b4de;
  case 0xd:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
    iVar8 = extraout_EDX_01;
LAB_0037b5eb:
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    iidentity4_sse4_1(in,in,iVar8,1,bd,0);
LAB_0037b7ad:
    cVar1 = piVar5[1];
    iVar8 = 0;
    goto LAB_0037b7c3;
  case 0xe:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iidentity4_sse4_1(in,in,stride,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    goto LAB_0037b861;
  case 0xf:
    in[0][0] = *(longlong *)input;
    in[0][1] = *(longlong *)(input + 2);
    in[1][0] = *(longlong *)(input + 4);
    in[1][1] = *(longlong *)(input + 6);
    in[2][0] = *(longlong *)(input + 8);
    in[2][1] = *(longlong *)(input + 10);
    in[3][0] = *(longlong *)(input + 0xc);
    in[3][1] = *(longlong *)(input + 0xe);
    iadst4x4_sse4_1(in,in,0xc,0,bd,0);
    uVar6 = (undefined4)in[1][1];
    uVar7 = in[1][1]._4_4_;
    lVar2 = CONCAT44((undefined4)in[1][0],(int)in[0][0]);
    lVar3 = CONCAT44((undefined4)in[3][0],(int)in[2][0]);
    in[1][0] = CONCAT44(in[1][0]._4_4_,in[0][0]._4_4_);
    in[1][1] = CONCAT44(in[3][0]._4_4_,in[2][0]._4_4_);
    in[2][0] = CONCAT44(uVar6,(int)in[0][1]);
    lVar4 = CONCAT44((undefined4)in[3][1],(int)in[2][1]);
    in[3][0] = CONCAT44(uVar7,in[0][1]._4_4_);
    in[3][1] = CONCAT44(in[3][1]._4_4_,in[2][1]._4_4_);
    in[0][0] = lVar2;
    in[0][1] = lVar3;
    in[2][1] = lVar4;
    iidentity4_sse4_1(in,in,bit,1,bd,0);
    break;
  default:
    goto switchD_0037afd8_default;
  }
  iVar8 = 1;
  cVar1 = piVar5[1];
LAB_0037b7c3:
  flipud = 0;
LAB_0037b888:
  write_buffer_4x4(in,output,stride,iVar8,flipud,-(int)cVar1,bd);
switchD_0037afd8_default:
  return;
}

Assistant:

void av1_inv_txfm2d_add_4x4_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_4X4];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 1, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case IDTX:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_DCT:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_ADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    default: assert(0);
  }
}